

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v7::detail::dragonbox::divisible_by_power_of_2(uint64_t x,int exp)

{
  long lVar1;
  
  if (exp < 1) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x6e2,"");
  }
  if (x != 0) {
    lVar1 = 0;
    if (x != 0) {
      for (; (x >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    return (uint)exp <= (uint)lVar1;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
              ,0x6e3,"");
}

Assistant:

inline bool divisible_by_power_of_2(uint64_t x, int exp) FMT_NOEXCEPT {
  FMT_ASSERT(exp >= 1, "");
  FMT_ASSERT(x != 0, "");
#ifdef FMT_BUILTIN_CTZLL
  return FMT_BUILTIN_CTZLL(x) >= exp;
#else
  return exp < num_bits<uint64_t>() && x == ((x >> exp) << exp);
#endif
}